

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::IntLoadResidual_Mv
          (ChBody *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  Index index;
  ulong uVar11;
  ulong uVar12;
  char *__function;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChVector<double> Iw;
  double local_90 [4];
  double *local_70;
  undefined8 local_68;
  ChVectorDynamic<> *local_58;
  ulong local_50;
  long local_40;
  ChVector<double> local_38;
  
  uVar11 = (ulong)off;
  local_40 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar11 < local_40) {
    lVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if ((long)uVar11 < lVar10) {
      local_70 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_70[uVar11];
      pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar13[uVar11];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = c * (this->variables).mass;
      auVar1 = vfmadd213sd_fma(auVar15,auVar19,auVar1);
      pdVar13[uVar11] = auVar1._0_8_;
      uVar11 = (ulong)(off + 1);
      if (local_40 <= (long)uVar11) goto LAB_0050c6da;
      if ((long)uVar11 < lVar10) {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_70[uVar11];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar13[uVar11];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = c * (this->variables).mass;
        auVar1 = vfmadd213sd_fma(auVar16,auVar20,auVar2);
        pdVar13[uVar11] = auVar1._0_8_;
        uVar11 = (ulong)(off + 2);
        if (local_40 <= (long)uVar11) goto LAB_0050c6da;
        if ((long)uVar11 < lVar10) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_70[uVar11];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar13[uVar11];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = c * (this->variables).mass;
          auVar1 = vfmadd213sd_fma(auVar17,auVar21,auVar3);
          pdVar13[uVar11] = auVar1._0_8_;
          uVar11 = (ulong)(off + 3);
          local_70 = local_70 + uVar11;
          local_68 = 3;
          local_90[3] = c;
          local_58 = w;
          local_50 = uVar11;
          if (local_40 + -3 < (long)uVar11) {
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
            ;
          }
          else {
            ChVector<double>::
            ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                      (&local_38,
                       (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_70,(type *)0x0);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_38.m_data[0];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[0];
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 local_38.m_data[1] *
                 *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
            auVar1 = vfmadd231sd_fma(auVar22,auVar14,auVar4);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_38.m_data[2];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(double *)
                            ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x10);
            auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar5);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(double *)
                            ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x18);
            auVar24._8_8_ = 0;
            auVar24._0_8_ =
                 local_38.m_data[1] *
                 *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x20);
            auVar15 = vfmadd231sd_fma(auVar24,auVar14,auVar6);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(double *)
                            ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x28);
            auVar15 = vfmadd231sd_fma(auVar15,auVar23,auVar7);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(double *)
                            ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x30);
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 local_38.m_data[1] *
                 *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x38);
            auVar19 = vfmadd231sd_fma(auVar18,auVar14,auVar8);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(double *)
                            ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x40);
            auVar19 = vfmadd231sd_fma(auVar19,auVar23,auVar9);
            local_90[0] = auVar1._0_8_ * local_90[3];
            local_90[1] = auVar15._0_8_ * local_90[3];
            local_90[2] = auVar19._0_8_ * local_90[3];
            if ((long)uVar11 <=
                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                + -3) {
              pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + uVar11;
              uVar11 = 3;
              if ((((ulong)pdVar13 & 7) == 0) &&
                 (uVar12 = (ulong)(-((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7), uVar12 < 3)) {
                uVar11 = uVar12;
              }
              if (uVar11 != 0) {
                uVar12 = 0;
                do {
                  pdVar13[uVar12] = local_90[uVar12] + pdVar13[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar11 != uVar12);
              }
              if (uVar11 < 3) {
                do {
                  pdVar13[uVar11] = local_90[uVar11] + pdVar13[uVar11];
                  uVar11 = uVar11 + 1;
                } while (uVar11 != 3);
              }
              return;
            }
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
            ;
          }
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_0050c6da:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChBody::IntLoadResidual_Mv(const unsigned int off,      // offset in R residual
                                ChVectorDynamic<>& R,        // result: the R residual, R += c*M*v
                                const ChVectorDynamic<>& w,  // the w vector
                                const double c               // a scaling factor
) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    ChVector<> Iw = GetInertia() * ChVector<>(w.segment(off + 3, 3));
    Iw *= c;
    R.segment(off + 3, 3) += Iw.eigen();
}